

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O3

void __thiscall BMRS<RemSP>::FirstScan(BMRS<RemSP> *this)

{
  int iVar1;
  uint data_width;
  int iVar2;
  long lVar3;
  uint64_t *puVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint64_t *puVar8;
  uint uVar9;
  long lVar10;
  uint64_t *puVar11;
  uint64_t *puVar12;
  uint64_t *puVar13;
  ulong uVar14;
  
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uVar9 = iVar1 / 2;
  data_width = (this->data_compressed).data_width;
  lVar3 = (long)(int)data_width;
  if (1 < iVar1) {
    puVar4 = (this->data_compressed).bits;
    puVar11 = (this->data_merged).bits;
    iVar2 = (this->data_merged).data_width;
    puVar8 = puVar4 + lVar3;
    uVar14 = 0;
    do {
      if (0 < (int)data_width) {
        uVar6 = 0;
        do {
          puVar11[uVar6] = puVar8[uVar6] | puVar4[uVar6];
          uVar6 = uVar6 + 1;
        } while (data_width != uVar6);
      }
      uVar14 = uVar14 + 1;
      puVar11 = puVar11 + iVar2;
      puVar8 = puVar8 + lVar3 * 2;
      puVar4 = puVar4 + lVar3 * 2;
    } while (uVar14 != uVar9);
  }
  if ((iVar1 % 2 != 0) && (0 < (int)data_width)) {
    puVar8 = (this->data_compressed).bits;
    iVar2 = (this->data_merged).data_width;
    puVar4 = (this->data_merged).bits;
    uVar14 = 0;
    do {
      puVar4[(long)iVar2 * (long)(int)uVar9 + uVar14] = puVar8[(iVar1 + -1) * lVar3 + uVar14];
      uVar14 = uVar14 + 1;
    } while (data_width != uVar14);
  }
  lVar5 = (long)(this->data_flags).height;
  if (0 < lVar5) {
    puVar4 = (this->data_compressed).bits;
    puVar11 = (this->data_flags).bits;
    lVar7 = (long)(this->data_flags).data_width;
    puVar8 = puVar4 + lVar3;
    lVar10 = 0;
    puVar12 = puVar11;
    puVar13 = puVar4;
    do {
      puVar13 = puVar13 + lVar3 * 2;
      puVar11[lVar10 * lVar7] =
           (puVar4[(lVar10 * 2 + 2) * lVar3] * 2 | puVar4[(lVar10 * 2 + 2) * lVar3]) &
           (puVar4[(lVar10 * 2 + 1) * lVar3] * 2 | puVar4[(lVar10 * 2 + 1) * lVar3]);
      if (1 < (int)data_width) {
        uVar14 = 1;
        do {
          puVar12[uVar14] =
               (puVar13[uVar14 - 1] >> 0x3f | puVar13[uVar14] << 1 | puVar13[uVar14]) &
               (puVar8[uVar14 - 1] >> 0x3f | puVar8[uVar14] << 1 | puVar8[uVar14]);
          uVar14 = uVar14 + 1;
        } while (data_width != uVar14);
      }
      lVar10 = lVar10 + 1;
      puVar12 = puVar12 + lVar7;
      puVar8 = puVar8 + lVar3 * 2;
    } while (lVar10 != lVar5);
  }
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  FindRuns(this,(this->data_merged).bits,(this->data_flags).bits,uVar9 + iVar1 % 2,data_width,
           (this->data_runs).runs);
  return;
}

Assistant:

void FirstScan() {
        int w(img_.cols);
        int h(img_.rows);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);
    }